

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int ddUpdateMtrTree(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  uint uVar1;
  MtrHalfWord MVar2;
  MtrHalfWord MVar3;
  int iVar4;
  int *invperm_00;
  MtrHalfWord MVar5;
  MtrHalfWord MVar6;
  long lVar7;
  
  if (treenode != (MtrNode *)0x0) {
    uVar1 = treenode->size;
    invperm_00 = (int *)(ulong)uVar1;
    MVar3 = 0xffffffff;
    MVar6 = 0;
    MVar5 = 0x7fffffff;
    for (lVar7 = (long)(int)treenode->low; (uint)lVar7 < uVar1 + treenode->low; lVar7 = lVar7 + 1) {
      MVar2 = perm[table->invperm[lVar7]];
      if ((int)MVar2 < (int)MVar5) {
        MVar3 = table->invperm[lVar7];
        MVar5 = MVar2;
      }
      if ((int)MVar6 < (int)MVar2) {
        MVar6 = MVar2;
      }
    }
    if (MVar3 == 0xffffffff) {
      return 0;
    }
    if ((MVar6 - MVar5) + 1 != uVar1) {
      return 0;
    }
    treenode->low = MVar5;
    treenode->index = MVar3;
    if ((treenode->child != (MtrNode *)0x0) &&
       (iVar4 = ddUpdateMtrTree(table,treenode->child,perm,invperm_00), iVar4 == 0)) {
      return 0;
    }
    if ((treenode->younger != (MtrNode *)0x0) &&
       (iVar4 = ddUpdateMtrTree(table,treenode->younger,perm,invperm_00), iVar4 == 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
ddUpdateMtrTree(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel, minIndex;

    if (treenode == NULL) return(1);

    minLevel = CUDD_MAXINDEX;
    maxLevel = 0;
    minIndex = -1;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel) {
            minLevel = level;
            minIndex = index;
        }
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (minIndex == -1) return(0);
    if (size == treenode->size) {
        treenode->low = minLevel;
        treenode->index = minIndex;
    } else {
        return(0);
    }

    if (treenode->child != NULL) {
        if (!ddUpdateMtrTree(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddUpdateMtrTree(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}